

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Base32Encoding.cpp
# Opt level: O1

size_t axl::enc::Base32Encoding::decode
                 (Array<char,_axl::sl::ArrayDetails<char>_> *buffer,StringRef *string)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::reserve(buffer,string->m_length * 5 >> 3);
  uVar8 = 0;
  sl::Array<char,_axl::sl::ArrayDetails<char>_>::
  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(buffer,0);
  if (0 < (long)string->m_length) {
    pbVar7 = (byte *)string->m_p;
    pbVar6 = pbVar7 + string->m_length;
    uVar4 = 0;
    do {
      if ((0xd6 < (byte)(*pbVar7 + 0xa5)) && (uVar3 = (ulong)(*pbVar7 - 0x32), 8 < uVar3 - 6)) {
        uVar8 = uVar8 << 5 | (uint)decode::charMap[uVar3];
        if (uVar4 < 3) {
          uVar4 = uVar4 + 5;
        }
        else {
          uVar4 = uVar4 - 3;
          sVar1 = (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
          bVar2 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::
                  setCountImpl<axl::sl::SimpleArrayDetails<char>::Construct>(buffer,sVar1 + 1);
          if (bVar2) {
            pcVar5 = (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_p + sVar1;
          }
          else {
            pcVar5 = (char *)0x0;
          }
          if (pcVar5 != (char *)0x0) {
            *pcVar5 = (char)(uVar8 >> ((byte)uVar4 & 0x1f));
          }
        }
      }
      pbVar7 = pbVar7 + 1;
    } while (pbVar7 < pbVar6);
  }
  return (buffer->super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>).m_count;
}

Assistant:

size_t
Base32Encoding::decode(
	sl::Array<char>* buffer,
	const sl::StringRef& string
) {
	static const uchar_t charMap['Z' - '2' + 1] = {
		26, 27, 28, 29, 30, 31,                             //  2 .. 7
		-1, -1, -1, -1, -1, -1, -1, -1, -1,                 //  8  9  :  ;  <  =  >  ?  @
		 0,  1,  2,  3,  4,  5,  6,  7,  8,  9, 10, 11, 12, //  A .. M
		13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, //  N .. Z
	};

	size_t sizeGuess = (string.getLength() * 5) / 8;
	buffer->reserve(sizeGuess);
	buffer->clear();

	uint_t x = 0;
	size_t i = 0;

	const char* p = string.cp();
	const char* end = string.getEnd();
	for (; p < end; p++) {
		char c = *p;
		if (c < '2' || c > 'Z')
			continue; // ignore padding & whitespace

		uchar_t y = charMap[c - '2'];
		if (y > 31)
			continue; // ignore padding & non-Base32 chars

		x <<= 5;
		x |= y;
		i += 5;

		if (i >= 8) {
			i -= 8;
			buffer->append(x >> i);
		}
	}

	return buffer->getCount();
}